

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O0

Section * create_section(ObjectUnit *ou,char *name,uint8_t *data,unsigned_long size)

{
  uint32_t uVar1;
  Section *pSVar2;
  size_t in_RCX;
  uint8_t *in_RDX;
  char *in_RSI;
  ObjectUnit *in_RDI;
  Section *s;
  
  pSVar2 = (Section *)alloczero(in_RCX);
  if (in_RSI == (char *)0x0) {
    pSVar2->name = "";
  }
  else {
    pSVar2->name = in_RSI;
  }
  pSVar2->data = in_RDX;
  pSVar2->size = in_RCX;
  pSVar2->obj = in_RDI;
  uVar1 = create_section::idcnt + 1;
  pSVar2->id = create_section::idcnt;
  create_section::idcnt = uVar1;
  initlist(&pSVar2->relocs);
  initlist(&pSVar2->xrefs);
  return pSVar2;
}

Assistant:

struct Section *create_section(struct ObjectUnit *ou,const char *name,
                               uint8_t *data,unsigned long size)
/* creates and initializes a Section node */
{
  static uint32_t idcnt = 0;
  struct Section *s = alloczero(sizeof(struct Section));

  if (name)
    s->name = name;
  else
    s->name = noname;
  s->data = data;
  s->size = size;
  s->obj = ou;
  s->id = idcnt++;       /* target dependant - ELF replaces this with shndx */
  initlist(&s->relocs);  /* empty relocation list */
  initlist(&s->xrefs);   /* empty xref list */
  return s;
}